

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_huffman_codes.cpp
# Opt level: O0

bool lzham::generate_huffman_codes
               (void *pContext,uint num_syms,uint16 *pFreq,uint8 *pCodesizes,uint *max_code_size,
               uint *total_freq_ret)

{
  uint a;
  long in_RCX;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  uint *in_R8;
  int *in_R9;
  uint len;
  uint i_2;
  uint max_len;
  uint i_1;
  int x [600];
  sym_freq *syms;
  sym_freq *sf;
  uint freq;
  uint i;
  uint num_used_syms;
  uint total_freq;
  uint max_freq;
  huffman_work_tables *state;
  uint local_9d4;
  uint local_9d0;
  uint local_9cc;
  uint local_9c8 [600];
  sym_freq *local_68;
  uint *local_60;
  uint local_54;
  uint local_50;
  uint local_4c;
  int local_48;
  uint local_44;
  long local_40;
  int *local_38;
  uint *local_30;
  long local_28;
  long local_20;
  uint local_14;
  bool local_1;
  
  if ((in_ESI == 0) || (600 < in_ESI)) {
    local_1 = false;
  }
  else {
    local_44 = 0;
    local_48 = 0;
    local_4c = 0;
    local_40 = in_RDI;
    local_38 = in_R9;
    local_30 = in_R8;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_14 = in_ESI;
    for (local_50 = 0; local_50 < local_14; local_50 = local_50 + 1) {
      local_54 = (uint)*(ushort *)(local_20 + (ulong)local_50 * 2);
      if (local_54 == 0) {
        *(undefined1 *)(local_28 + (ulong)local_50) = 0;
      }
      else {
        local_48 = local_54 + local_48;
        local_44 = math::maximum<unsigned_int>(local_44,local_54);
        local_60 = (uint *)(local_40 + (ulong)local_4c * 8);
        *(short *)(local_60 + 1) = (short)local_50;
        *(undefined2 *)((long)local_60 + 6) = 0xffff;
        *local_60 = local_54;
        local_4c = local_4c + 1;
      }
    }
    *local_38 = local_48;
    if (local_4c == 1) {
      *(undefined1 *)(local_28 + (ulong)*(ushort *)(local_40 + 4)) = 1;
      local_1 = true;
    }
    else {
      local_68 = radix_sort_syms(x[0xb1],(sym_freq *)x._696_8_,(sym_freq *)x._688_8_);
      for (local_9cc = 0; local_9cc < local_4c; local_9cc = local_9cc + 1) {
        local_9c8[local_9cc] = local_68[local_9cc].m_freq;
      }
      calculate_minimum_redundancy((int *)local_9c8,local_4c);
      local_9d0 = 0;
      for (local_9d4 = 0; local_9d4 < local_4c; local_9d4 = local_9d4 + 1) {
        a = local_9c8[local_9d4];
        local_9d0 = math::maximum<unsigned_int>(a,local_9d0);
        *(char *)(local_28 + (ulong)local_68[local_9d4].m_left) = (char)a;
      }
      *local_30 = local_9d0;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool generate_huffman_codes(void* pContext, uint num_syms, const uint16* pFreq, uint8* pCodesizes, uint& max_code_size, uint& total_freq_ret)
   {
      if ((!num_syms) || (num_syms > cHuffmanMaxSupportedSyms))
         return false;
                  
      huffman_work_tables& state = *static_cast<huffman_work_tables*>(pContext);;
            
      uint max_freq = 0;
      uint total_freq = 0;
      
      uint num_used_syms = 0;
      for (uint i = 0; i < num_syms; i++)
      {
         uint freq = pFreq[i];
         
         if (!freq)
            pCodesizes[i] = 0;
         else
         {
            total_freq += freq;
            max_freq = math::maximum(max_freq, freq);
            
            sym_freq& sf = state.syms0[num_used_syms];
            sf.m_left = (uint16)i;
            sf.m_right = UINT16_MAX;
            sf.m_freq = freq;
            num_used_syms++;
         }            
      }
      
      total_freq_ret = total_freq;

      if (num_used_syms == 1)
      {
         pCodesizes[state.syms0[0].m_left] = 1;
         return true;
      }

      sym_freq* syms = radix_sort_syms(num_used_syms, state.syms0, state.syms1);
      
#if USE_CALCULATE_MINIMUM_REDUNDANCY
      int x[cHuffmanMaxSupportedSyms];
      for (uint i = 0; i < num_used_syms; i++)
         x[i] = syms[i].m_freq;
      
      calculate_minimum_redundancy(x, num_used_syms);
      
      uint max_len = 0;
      for (uint i = 0; i < num_used_syms; i++)
      {
         uint len = x[i];
         max_len = math::maximum(len, max_len);
         pCodesizes[syms[i].m_left] = static_cast<uint8>(len);
      }
      max_code_size = max_len;
#else    
      // Computes Huffman codelengths in linear time. More readable than calculate_minimum_redundancy(), and approximately the same speed, but not in-place.
      
      // Dummy node
      sym_freq& sf = state.syms0[num_used_syms];
      sf.m_left = UINT16_MAX;
      sf.m_right = UINT16_MAX;
      sf.m_freq = UINT_MAX;
      
      uint next_internal_node = num_used_syms + 1;
            
      uint queue_front = 0;
      uint queue_end = 0;
            
      uint next_lowest_sym = 0;
      
      uint num_nodes_remaining = num_used_syms;
      do
      {
         uint left_freq = syms[next_lowest_sym].m_freq;
         uint left_child = next_lowest_sym;
         
         if ((queue_end > queue_front) && (syms[state.queue[queue_front]].m_freq < left_freq))
         {
            left_child = state.queue[queue_front];
            left_freq = syms[left_child].m_freq;
            
            queue_front++;
         }
         else
            next_lowest_sym++;
         
         uint right_freq = syms[next_lowest_sym].m_freq;
         uint right_child = next_lowest_sym;

         if ((queue_end > queue_front) && (syms[state.queue[queue_front]].m_freq < right_freq))
         {
            right_child = state.queue[queue_front];
            right_freq = syms[right_child].m_freq;
            
            queue_front++;
         }
         else
            next_lowest_sym++;
      
         LZHAM_ASSERT(next_internal_node < huffman_work_tables::cMaxInternalNodes);
         
         const uint internal_node_index = next_internal_node;
         next_internal_node++;
         
         syms[internal_node_index].m_freq = left_freq + right_freq;
         syms[internal_node_index].m_left = static_cast<uint16>(left_child);
         syms[internal_node_index].m_right = static_cast<uint16>(right_child);
         
         LZHAM_ASSERT(queue_end < huffman_work_tables::cMaxInternalNodes);
         state.queue[queue_end] = static_cast<uint16>(internal_node_index);
         queue_end++;
                  
         num_nodes_remaining--;
         
      } while (num_nodes_remaining > 1);
      
      LZHAM_ASSERT(next_lowest_sym == num_used_syms);
      LZHAM_ASSERT((queue_end - queue_front) == 1);
      
      uint cur_node_index = state.queue[queue_front];
      
      uint32* pStack = (syms == state.syms0) ? (uint32*)state.syms1 : (uint32*)state.syms0;
      uint32* pStack_top = pStack;

      uint max_level = 0;
      
      for ( ; ; ) 
      {
         uint level = cur_node_index >> 16;
         uint node_index = cur_node_index & 0xFFFF;
         
         uint left_child = syms[node_index].m_left;
         uint right_child = syms[node_index].m_right;
         
         uint next_level = (cur_node_index + 0x10000) & 0xFFFF0000;
                           
         if (left_child < num_used_syms)
         {
            max_level = math::maximum(max_level, level);
            
            pCodesizes[syms[left_child].m_left] = static_cast<uint8>(level + 1);
            
            if (right_child < num_used_syms)
            {
               pCodesizes[syms[right_child].m_left] = static_cast<uint8>(level + 1);
               
               if (pStack == pStack_top) break;
               cur_node_index = *--pStack;
            }
            else
            {
               cur_node_index = next_level | right_child;
            }
         }
         else
         {
            if (right_child < num_used_syms)
            {
               max_level = math::maximum(max_level, level);
               
               pCodesizes[syms[right_child].m_left] = static_cast<uint8>(level + 1);
                              
               cur_node_index = next_level | left_child;
            }
            else
            {
               *pStack++ = next_level | left_child;
                              
               cur_node_index = next_level | right_child;
            }
         }
      }
      
      max_code_size = max_level + 1;
#endif
                  
      return true;
   }